

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void writeModelBoundSolution
               (FILE *file,HighsLogOptions *log_options,bool columns,HighsInt dim,
               vector<double,_std::allocator<double>_> *lower,
               vector<double,_std::allocator<double>_> *upper,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,bool have_primal,vector<double,_std::allocator<double>_> *primal,
               bool have_dual,vector<double,_std::allocator<double>_> *dual,bool have_basis,
               vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *status,
               HighsVarType *integrality)

{
  HighsLogOptions *log_options_;
  undefined7 in_register_00000011;
  long lVar1;
  char *pcVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  ulong uVar5;
  string s;
  stringstream ss;
  string local_270;
  vector<double,_std::allocator<double>_> *local_250;
  vector<double,_std::allocator<double>_> *local_248;
  pointer local_240;
  pointer local_238;
  FILE *local_230;
  HighsLogOptions *local_228;
  ulong local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_238 = (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_240 = (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar2 = "Rows\n";
  if ((int)CONCAT71(in_register_00000011,columns) != 0) {
    pcVar2 = "Columns\n";
  }
  std::__cxx11::string::string((string *)&local_1d8,pcVar2,(allocator *)&local_270);
  highsFprintfString(file,log_options,&local_1d8);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_270._M_string_length = 0;
  local_270.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  std::__cxx11::string::~string((string *)&local_270);
  std::operator<<((ostream *)local_1a8,
                  "    Index Status        Lower        Upper       Primal         Dual");
  if (integrality != (HighsVarType *)0x0) {
    std::operator<<((ostream *)local_1a8,"  Type      ");
  }
  pcVar2 = "  Name\n";
  if (local_240 == local_238) {
    pcVar2 = "\n";
  }
  std::operator<<((ostream *)local_1a8,pcVar2);
  std::__cxx11::stringbuf::str();
  local_250 = lower;
  local_248 = upper;
  local_230 = file;
  highsFprintfString(file,log_options,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  if (dim < 1) {
    dim = 0;
  }
  local_220 = (ulong)(uint)dim;
  lVar1 = 0;
  local_228 = log_options;
  for (uVar5 = 0; local_220 != uVar5; uVar5 = uVar5 + 1) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    std::__cxx11::string::~string((string *)&local_270);
    pvVar4 = local_248;
    pvVar3 = local_250;
    if (have_basis) {
      statusToString_abi_cxx11_
                (&local_270,
                 (status->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar5],
                 (local_250->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5],
                 (local_248->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5]);
    }
    else {
      std::__cxx11::string::string((string *)&local_270,"",(allocator *)&local_218);
      pvVar3 = local_250;
      pvVar4 = local_248;
    }
    highsFormatToString_abi_cxx11_
              (&local_218,"%9d   %4s %12g %12g",
               (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar5],
               (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar5],uVar5 & 0xffffffff,local_270._M_dataplus._M_p
              );
    std::operator<<((ostream *)local_1a8,(string *)&local_218);
    log_options_ = local_228;
    std::__cxx11::string::~string((string *)&local_218);
    if (have_primal) {
      highsFormatToString_abi_cxx11_
                (&local_218," %12g",
                 (primal->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5]);
      std::operator<<((ostream *)local_1a8,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
    }
    else {
      std::operator<<((ostream *)local_1a8,"             ");
    }
    if (have_dual) {
      highsFormatToString_abi_cxx11_
                (&local_218," %12g",
                 (dual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5]);
      std::operator<<((ostream *)local_1a8,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
    }
    else {
      std::operator<<((ostream *)local_1a8,"             ");
    }
    if (integrality != (HighsVarType *)0x0) {
      typeToString_abi_cxx11_(&local_1f8,integrality[uVar5]);
      highsFormatToString_abi_cxx11_(&local_218,"  %s",local_1f8._M_dataplus._M_p);
      std::operator<<((ostream *)local_1a8,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    if (local_240 == local_238) {
      std::operator<<((ostream *)local_1a8,"\n");
    }
    else {
      highsFormatToString_abi_cxx11_
                (&local_218,"  %-s\n",
                 *(undefined8 *)
                  ((long)&(((names->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1))
      ;
      std::operator<<((ostream *)local_1a8,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(local_230,log_options_,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_270);
    lVar1 = lVar1 + 0x20;
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void writeModelBoundSolution(
    FILE* file, const HighsLogOptions& log_options, const bool columns,
    const HighsInt dim, const std::vector<double>& lower,
    const std::vector<double>& upper, const std::vector<std::string>& names,
    const bool have_primal, const std::vector<double>& primal,
    const bool have_dual, const std::vector<double>& dual,
    const bool have_basis, const std::vector<HighsBasisStatus>& status,
    const HighsVarType* integrality) {
  const bool have_names = names.size() > 0;
  if (have_names) assert((int)names.size() >= dim);
  if (have_primal) assert((int)primal.size() >= dim);
  if (have_dual) assert((int)dual.size() >= dim);
  if (have_basis) assert((int)status.size() >= dim);
  const bool have_integrality = integrality != NULL;
  std::stringstream ss;
  std::string s = columns ? "Columns\n" : "Rows\n";
  highsFprintfString(file, log_options, s);
  ss.str(std::string());
  ss << "    Index Status        Lower        Upper       Primal         Dual";
  if (have_integrality) ss << "  Type      ";
  if (have_names) {
    ss << "  Name\n";
  } else {
    ss << "\n";
  }
  highsFprintfString(file, log_options, ss.str());
  for (HighsInt ix = 0; ix < dim; ix++) {
    ss.str(std::string());
    std::string var_status_string =
        have_basis ? statusToString(status[ix], lower[ix], upper[ix]) : "";
    ss << highsFormatToString("%9" HIGHSINT_FORMAT "   %4s %12g %12g", ix,
                              var_status_string.c_str(), lower[ix], upper[ix]);
    if (have_primal) {
      ss << highsFormatToString(" %12g", primal[ix]);
    } else {
      ss << "             ";
    }
    if (have_dual) {
      ss << highsFormatToString(" %12g", dual[ix]);
    } else {
      ss << "             ";
    }
    if (have_integrality)
      ss << highsFormatToString("  %s", typeToString(integrality[ix]).c_str());
    if (have_names) {
      ss << highsFormatToString("  %-s\n", names[ix].c_str());
    } else {
      ss << "\n";
    }
    highsFprintfString(file, log_options, ss.str());
  }
}